

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_concat(lua_State *L,int total)

{
  StkId obj;
  lua_CFunction p_Var1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  TString *pTVar5;
  long lVar6;
  ulong l;
  size_t sVar7;
  StkId pTVar8;
  TValue *io1;
  int iVar9;
  StkId pTVar10;
  ulong uVar11;
  long lVar12;
  char buff [40];
  char local_58 [40];
  
  pTVar10 = L->top;
  do {
    pTVar8 = pTVar10 + -2;
    if ((pTVar10[-2].tt_ & 0xfU) - 3 < 2) {
      obj = pTVar10 + -1;
      uVar3 = pTVar10[-1].tt_;
      if ((uVar3 & 0xf) != 4) {
        if ((uVar3 & 0xf) != 3) goto LAB_0011c3f3;
        luaO_tostring(L,obj);
        uVar3 = pTVar10[-1].tt_;
      }
      if (uVar3 == 0x44) {
        uVar3 = pTVar10[-2].tt_;
        if (pTVar10[-1].value_.f[0xb] != (_func_int_lua_State_ptr)0x0) goto LAB_0011c41d;
        iVar9 = 1;
        if ((uVar3 & 0xf) == 3) {
          luaO_tostring(L,pTVar8);
        }
      }
      else {
        uVar3 = pTVar10[-2].tt_;
LAB_0011c41d:
        if ((uVar3 == 0x44) && ((pTVar8->value_).f[0xb] == (_func_int_lua_State_ptr)0x0)) {
          iVar9 = pTVar10[-1].tt_;
          uVar2 = *(undefined4 *)&pTVar10[-1].field_0xc;
          pTVar8->value_ = obj->value_;
          pTVar10[-2].tt_ = iVar9;
          *(undefined4 *)&pTVar10[-2].field_0xc = uVar2;
          goto LAB_0011c40e;
        }
        p_Var1 = (obj->value_).f;
        if (p_Var1[8] == (_func_int_lua_State_ptr)0x4) {
          l = (ulong)(byte)p_Var1[0xb];
        }
        else {
          l = *(ulong *)(p_Var1 + 0x10);
        }
        uVar11 = 1;
        if (1 < total) {
          uVar11 = 1;
          do {
            uVar3 = pTVar8->tt_ & 0xf;
            if (uVar3 != 4) {
              if (uVar3 != 3) goto LAB_0011c4ac;
              luaO_tostring(L,pTVar8);
            }
            p_Var1 = (pTVar8->value_).f;
            if (p_Var1[8] == (_func_int_lua_State_ptr)0x4) {
              uVar4 = (ulong)(byte)p_Var1[0xb];
            }
            else {
              uVar4 = *(ulong *)(p_Var1 + 0x10);
            }
            if ((l ^ 0x7fffffffffffffff) <= uVar4) {
              luaG_runerror(L,"string length overflow");
            }
            l = l + uVar4;
            uVar11 = uVar11 + 1;
            pTVar8 = pTVar8 + -1;
          } while ((uint)total != uVar11);
          uVar11 = (ulong)(uint)total;
        }
LAB_0011c4ac:
        uVar4 = uVar11 & 0xffffffff;
        if (l < 0x29) {
          lVar6 = uVar4 + 1;
          pTVar8 = pTVar10 + -uVar4;
          lVar12 = 0;
          do {
            p_Var1 = (pTVar8->value_).f;
            if (p_Var1[8] == (_func_int_lua_State_ptr)0x4) {
              sVar7 = (size_t)(byte)p_Var1[0xb];
            }
            else {
              sVar7 = *(size_t *)(p_Var1 + 0x10);
            }
            memcpy(local_58 + lVar12,p_Var1 + 0x18,sVar7);
            lVar12 = lVar12 + sVar7;
            lVar6 = lVar6 + -1;
            pTVar8 = pTVar8 + 1;
          } while (1 < lVar6);
          pTVar5 = luaS_newlstr(L,local_58,l);
        }
        else {
          pTVar5 = luaS_createlngstrobj(L,l);
          lVar6 = uVar4 + 1;
          pTVar8 = pTVar10 + -uVar4;
          lVar12 = 0;
          do {
            p_Var1 = (pTVar8->value_).f;
            if (p_Var1[8] == (_func_int_lua_State_ptr)0x4) {
              sVar7 = (size_t)(byte)p_Var1[0xb];
            }
            else {
              sVar7 = *(size_t *)(p_Var1 + 0x10);
            }
            memcpy((void *)((long)&pTVar5[1].next + lVar12),p_Var1 + 0x18,sVar7);
            lVar12 = lVar12 + sVar7;
            lVar6 = lVar6 + -1;
            pTVar8 = pTVar8 + 1;
          } while (1 < lVar6);
        }
        pTVar10[-uVar4].value_.gc = (GCObject *)pTVar5;
        pTVar10[-uVar4].tt_ = pTVar5->tt | 0x40;
        iVar9 = (int)uVar11 + -1;
      }
    }
    else {
LAB_0011c3f3:
      luaT_trybinTM(L,pTVar8,pTVar10 + -1,pTVar8,TM_CONCAT);
LAB_0011c40e:
      iVar9 = 1;
    }
    total = total - iVar9;
    pTVar10 = L->top + -(long)iVar9;
    L->top = pTVar10;
    if (total < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat(lua_State *L, int total) {
    lua_assert(total >= 2);
    do {
        StkId top = L->top;
        int n = 2;  /* number of elements handled in this pass (at least 2) */
        if (!(ttisstring(top - 2) || cvt2str(top - 2)) || !tostring(L, top - 1))
            luaT_trybinTM(L, top - 2, top - 1, top - 2, TM_CONCAT);
        else if (isemptystr(top - 1))  /* second operand is empty? */
            cast_void(tostring(L, top - 2));  /* result is first operand */
        else if (isemptystr(top - 2)) {  /* first operand is an empty string? */
            setobjs2s(L, top - 2, top - 1);  /* result is second op. */
        } else {
            /* at least two non-empty string values; get as many as possible */
            size_t tl = vslen(top - 1);
            TString *ts;
            /* collect total length and number of strings */
            for (n = 1; n < total && tostring(L, top - n - 1); n++) {
                size_t l = vslen(top - n - 1);
                if (l >= (MAX_SIZE / sizeof(char)) - tl)
                    luaG_runerror(L, "string length overflow");
                tl += l;
            }
            if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
                char buff[LUAI_MAXSHORTLEN];
                copy2buff(top, n, buff);  /* copy strings to buffer */
                ts = luaS_newlstr(L, buff, tl);
            } else {  /* long string; copy strings directly to final result */
                ts = luaS_createlngstrobj(L, tl);
                copy2buff(top, n, getstr(ts));
            }
            setsvalue2s(L, top - n, ts);  /* create result */
        }
        total -= n - 1;  /* got 'n' strings to create 1 new */
        L->top -= n - 1;  /* popped 'n' strings and pushed one */
    } while (total > 1);  /* repeat until only 1 result left */
}